

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int raviX_parse(CompilerState *compiler_state,char *buffer,size_t buflen,char *name)

{
  int iVar1;
  undefined1 local_50 [4];
  int rc;
  ParserState parser_state;
  LexerState *lexstate;
  char *name_local;
  size_t buflen_local;
  char *buffer_local;
  CompilerState *compiler_state_local;
  
  parser_state.current_scope = (Scope *)raviX_init_lexer(compiler_state,buffer,buflen,name);
  parser_state_init((ParserState *)local_50,(LexerState *)parser_state.current_scope,compiler_state)
  ;
  iVar1 = _setjmp((__jmp_buf_tag *)compiler_state->env);
  if (iVar1 == 0) {
    parse_lua_chunk((ParserState *)local_50);
  }
  raviX_destroy_lexer((LexerState *)parser_state.current_scope);
  return iVar1;
}

Assistant:

int raviX_parse(CompilerState *compiler_state, const char *buffer, size_t buflen, const char *name)
{
	LexerState *lexstate = raviX_init_lexer(compiler_state, buffer, buflen, name);
	ParserState parser_state;
	parser_state_init(&parser_state, lexstate, compiler_state);
	int rc = setjmp(compiler_state->env);
	if (rc == 0) {
		parse_lua_chunk(&parser_state);
	}
	raviX_destroy_lexer(lexstate);
	return rc;
}